

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O0

void __thiscall
soplex::SPxLPBase<double>::changeElement(SPxLPBase<double> *this,int i,int j,double *val,bool scale)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  SVectorBase<double> *this_00;
  SVectorBase<double> *this_01;
  element_type *this_02;
  double *pdVar4;
  double *in_RCX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  byte in_R8B;
  double newVal;
  SVectorBase<double> *col;
  SVectorBase<double> *row;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  SPxLPBase<double> *in_stack_ffffffffffffff50;
  int i_00;
  SVectorBase<double> *in_stack_ffffffffffffff58;
  LPRowSetBase<double> *in_stack_ffffffffffffff60;
  double local_58;
  
  if ((-1 < in_ESI) && (-1 < in_EDX)) {
    this_00 = rowVector_w(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
    this_01 = colVector_w(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
    tolerances((SPxLPBase<double> *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    this_02 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x261539);
    Tolerances::epsilon(this_02);
    bVar1 = isNotZero<double,double>
                      ((double)in_stack_ffffffffffffff50,
                       (double)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x26156a);
    if (bVar1) {
      if ((in_R8B & 1) == 0) {
        local_58 = *in_RCX;
      }
      else {
        local_58 = (double)(**(code **)(**(long **)(in_RDI + 0x1a8) + 0x150))
                                     (*in_RCX,*(long **)(in_RDI + 0x1a8),in_RDI,in_ESI,in_EDX);
      }
      iVar2 = SVectorBase<double>::pos
                        (in_stack_ffffffffffffff58,(int)((ulong)in_stack_ffffffffffffff50 >> 0x20));
      if ((iVar2 < 0) ||
         (iVar2 = SVectorBase<double>::pos
                            (in_stack_ffffffffffffff58,
                             (int)((ulong)in_stack_ffffffffffffff50 >> 0x20)), iVar2 < 0)) {
        LPRowSetBase<double>::add2
                  (in_stack_ffffffffffffff60,(int)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                   (int)in_stack_ffffffffffffff58,(int *)in_stack_ffffffffffffff50,
                   (double *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        LPColSetBase<double>::add2
                  ((LPColSetBase<double> *)in_stack_ffffffffffffff60,
                   (int)((ulong)in_stack_ffffffffffffff58 >> 0x20),(int)in_stack_ffffffffffffff58,
                   (int *)in_stack_ffffffffffffff50,
                   (double *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      }
      else {
        iVar2 = SVectorBase<double>::pos
                          (in_stack_ffffffffffffff58,(int)((ulong)in_stack_ffffffffffffff50 >> 0x20)
                          );
        i_00 = (int)((ulong)in_stack_ffffffffffffff50 >> 0x20);
        pdVar4 = SVectorBase<double>::value(this_00,iVar2);
        *pdVar4 = local_58;
        iVar2 = SVectorBase<double>::pos(in_stack_ffffffffffffff58,i_00);
        pdVar4 = SVectorBase<double>::value(this_01,iVar2);
        *pdVar4 = local_58;
      }
    }
    else {
      iVar2 = SVectorBase<double>::pos
                        (in_stack_ffffffffffffff58,(int)((ulong)in_stack_ffffffffffffff50 >> 0x20));
      if ((-1 < iVar2) &&
         (iVar2 = SVectorBase<double>::pos
                            (in_stack_ffffffffffffff58,
                             (int)((ulong)in_stack_ffffffffffffff50 >> 0x20)), -1 < iVar2)) {
        uVar3 = SVectorBase<double>::pos(in_stack_ffffffffffffff58,(int)((ulong)this_00 >> 0x20));
        SVectorBase<double>::remove(this_00,(char *)(ulong)uVar3);
        uVar3 = SVectorBase<double>::pos(this_01,(int)((ulong)this_00 >> 0x20));
        SVectorBase<double>::remove(this_01,(char *)(ulong)uVar3);
      }
    }
  }
  return;
}

Assistant:

virtual void changeElement(int i, int j, const R& val, bool scale = false)
   {
      if(i < 0 || j < 0)
         return;

      SVectorBase<R>& row = rowVector_w(i);
      SVectorBase<R>& col = colVector_w(j);

      if(isNotZero(val, this->tolerances()->epsilon()))
      {
         R newVal;

         if(scale)
         {
            assert(_isScaled);
            assert(lp_scaler);
            newVal = lp_scaler->scaleElement(*this, i, j, val);
         }
         else
            newVal = val;

         if(row.pos(j) >= 0 && col.pos(i) >= 0)
         {
            row.value(row.pos(j)) = newVal;
            col.value(col.pos(i)) = newVal;
         }
         else
         {
            LPRowSetBase<R>::add2(i, 1, &j, &newVal);
            LPColSetBase<R>::add2(j, 1, &i, &newVal);
         }
      }
      else if(row.pos(j) >= 0 && col.pos(i) >= 0)
      {
         row.remove(row.pos(j));
         col.remove(col.pos(i));
      }

      assert(isConsistent());
   }